

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitInvoke(RegSlot location,RegSlot callObjLocation,PropertyId propertyId,
               ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  ProfileId callSiteId;
  FuncInfo *funcInfo_00;
  
  EmitMethodFld(false,false,location,callObjLocation,propertyId,byteCodeGenerator,funcInfo,true);
  FuncInfo::StartRecordingOutArgs(funcInfo,1);
  callSiteId = ByteCodeGenerator::GetNextCallSiteId(byteCodeGenerator,CallI);
  Js::ByteCodeWriter::StartCall(&byteCodeGenerator->m_writer,StartCall,1);
  EmitArgListStart(callObjLocation,byteCodeGenerator,funcInfo_00,callSiteId);
  Js::ByteCodeWriter::CallI
            (&byteCodeGenerator->m_writer,CallI,location,location,1,callSiteId,CallFlags_None);
  return;
}

Assistant:

void EmitInvoke(
    Js::RegSlot location,
    Js::RegSlot callObjLocation,
    Js::PropertyId propertyId,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    EmitMethodFld(false, false, location, callObjLocation, propertyId, byteCodeGenerator, funcInfo);

    funcInfo->StartRecordingOutArgs(1);

    Js::ProfileId callSiteId = byteCodeGenerator->GetNextCallSiteId(Js::OpCode::CallI);

    byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, 1);
    EmitArgListStart(callObjLocation, byteCodeGenerator, funcInfo, callSiteId);

    byteCodeGenerator->Writer()->CallI(Js::OpCode::CallI, location, location, 1, callSiteId);
}